

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_decode_tiles
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  OPJ_BYTE *pOVar2;
  OPJ_OFF_T OVar3;
  OPJ_BYTE *l_new_current_data;
  OPJ_BYTE *pOStack_68;
  OPJ_UINT32 nr_tiles;
  OPJ_BYTE *l_current_data;
  OPJ_INT32 local_58;
  OPJ_UINT32 l_nb_comps;
  OPJ_INT32 l_tile_y1;
  OPJ_INT32 l_tile_x1;
  OPJ_INT32 l_tile_y0;
  OPJ_INT32 l_tile_x0;
  OPJ_UINT32 l_max_data_size;
  OPJ_UINT32 l_data_size;
  OPJ_UINT32 l_current_tile_no;
  OPJ_BOOL l_go_on;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  l_data_size = 1;
  l_new_current_data._4_4_ = 0;
  _l_current_tile_no = p_manager;
  p_manager_local = (opj_event_mgr_t *)p_stream;
  p_stream_local = (opj_stream_private_t *)p_j2k;
  pOStack_68 = (OPJ_BYTE *)opj_malloc(1000);
  if (pOStack_68 == (OPJ_BYTE *)0x0) {
    opj_event_msg(_l_current_tile_no,1,"Not enough memory to decode tiles\n");
    p_j2k_local._4_4_ = 0;
  }
  else {
    l_tile_y0 = 1000;
    while( true ) {
      OVar1 = opj_j2k_read_tile_header
                        ((opj_j2k_t *)p_stream_local,&l_max_data_size,(OPJ_UINT32 *)&l_tile_x0,
                         &l_tile_x1,&l_tile_y1,(OPJ_INT32 *)&l_nb_comps,&local_58,
                         (OPJ_UINT32 *)((long)&l_current_data + 4),(OPJ_BOOL *)&l_data_size,
                         (opj_stream_private_t *)p_manager_local,_l_current_tile_no);
      if (OVar1 == 0) {
        opj_free(pOStack_68);
        return 0;
      }
      if (l_data_size == 0) break;
      if ((uint)l_tile_y0 < (uint)l_tile_x0) {
        pOVar2 = (OPJ_BYTE *)opj_realloc(pOStack_68,(ulong)(uint)l_tile_x0);
        if (pOVar2 == (OPJ_BYTE *)0x0) {
          opj_free(pOStack_68);
          opj_event_msg(_l_current_tile_no,1,"Not enough memory to decode tile %d/%d\n",
                        (ulong)(l_max_data_size + 1),
                        (ulong)(uint)(*(int *)((long)&p_stream_local[1].m_read_fn + 4) *
                                     *(int *)&p_stream_local[1].m_read_fn));
          return 0;
        }
        l_tile_y0 = l_tile_x0;
        pOStack_68 = pOVar2;
      }
      OVar1 = opj_j2k_decode_tile((opj_j2k_t *)p_stream_local,l_max_data_size,pOStack_68,l_tile_x0,
                                  (opj_stream_private_t *)p_manager_local,_l_current_tile_no);
      if (OVar1 == 0) {
        opj_free(pOStack_68);
        opj_event_msg(_l_current_tile_no,1,"Failed to decode tile %d/%d\n",
                      (ulong)(l_max_data_size + 1),
                      (ulong)(uint)(*(int *)((long)&p_stream_local[1].m_read_fn + 4) *
                                   *(int *)&p_stream_local[1].m_read_fn));
        return 0;
      }
      opj_event_msg(_l_current_tile_no,4,"Tile %d/%d has been decoded.\n",
                    (ulong)(l_max_data_size + 1),
                    (ulong)(uint)(*(int *)((long)&p_stream_local[1].m_read_fn + 4) *
                                 *(int *)&p_stream_local[1].m_read_fn));
      OVar1 = opj_j2k_update_image_data
                        ((opj_tcd_t *)p_stream_local[2].m_stored_data,pOStack_68,
                         (opj_image_t *)p_stream_local->m_buffer_size);
      if (OVar1 == 0) {
        opj_free(pOStack_68);
        return 0;
      }
      opj_event_msg(_l_current_tile_no,4,"Image data has been updated with tile %d.\n\n",
                    (ulong)(l_max_data_size + 1));
      OVar3 = opj_stream_get_number_byte_left((opj_stream_private_t *)p_manager_local);
      if (((OVar3 == 0) && (*(int *)&p_stream_local->m_free_user_data_fn == 0x40)) ||
         (l_new_current_data._4_4_ = l_new_current_data._4_4_ + 1,
         l_new_current_data._4_4_ ==
         *(int *)((long)&p_stream_local[1].m_read_fn + 4) * *(int *)&p_stream_local[1].m_read_fn))
      break;
    }
    opj_free(pOStack_68);
    p_j2k_local._4_4_ = 1;
  }
  return p_j2k_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_j2k_decode_tiles ( opj_j2k_t *p_j2k,
                                                            opj_stream_private_t *p_stream,
                                                            opj_event_mgr_t * p_manager)
{
        OPJ_BOOL l_go_on = OPJ_TRUE;
        OPJ_UINT32 l_current_tile_no;
        OPJ_UINT32 l_data_size,l_max_data_size;
        OPJ_INT32 l_tile_x0,l_tile_y0,l_tile_x1,l_tile_y1;
        OPJ_UINT32 l_nb_comps;
        OPJ_BYTE * l_current_data;
        OPJ_UINT32 nr_tiles = 0;

        l_current_data = (OPJ_BYTE*)opj_malloc(1000);
        if (! l_current_data) {
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to decode tiles\n");
                return OPJ_FALSE;
        }
        l_max_data_size = 1000;

		for (;;) {
                if (! opj_j2k_read_tile_header( p_j2k,
                                        &l_current_tile_no,
                                        &l_data_size,
                                        &l_tile_x0, &l_tile_y0,
                                        &l_tile_x1, &l_tile_y1,
                                        &l_nb_comps,
                                        &l_go_on,
                                        p_stream,
                                        p_manager)) {
                        opj_free(l_current_data);
                        return OPJ_FALSE;
                }

                if (! l_go_on) {
                        break;
                }

                if (l_data_size > l_max_data_size) {
                        OPJ_BYTE *l_new_current_data = (OPJ_BYTE *) opj_realloc(l_current_data, l_data_size);
                        if (! l_new_current_data) {
                                opj_free(l_current_data);
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to decode tile %d/%d\n", l_current_tile_no +1, p_j2k->m_cp.th * p_j2k->m_cp.tw);
                                return OPJ_FALSE;
                        }
                        l_current_data = l_new_current_data;
                        l_max_data_size = l_data_size;
                }

                if (! opj_j2k_decode_tile(p_j2k,l_current_tile_no,l_current_data,l_data_size,p_stream,p_manager)) {
                        opj_free(l_current_data);
                        opj_event_msg(p_manager, EVT_ERROR, "Failed to decode tile %d/%d\n", l_current_tile_no +1, p_j2k->m_cp.th * p_j2k->m_cp.tw);
                        return OPJ_FALSE;
                }
                opj_event_msg(p_manager, EVT_INFO, "Tile %d/%d has been decoded.\n", l_current_tile_no +1, p_j2k->m_cp.th * p_j2k->m_cp.tw);

                if (! opj_j2k_update_image_data(p_j2k->m_tcd,l_current_data, p_j2k->m_output_image)) {
                        opj_free(l_current_data);
                        return OPJ_FALSE;
                }
                opj_event_msg(p_manager, EVT_INFO, "Image data has been updated with tile %d.\n\n", l_current_tile_no + 1);
                
                if(opj_stream_get_number_byte_left(p_stream) == 0  
                    && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC)
                    break;
                if(++nr_tiles ==  p_j2k->m_cp.th * p_j2k->m_cp.tw) 
                    break;
        }

        opj_free(l_current_data);

        return OPJ_TRUE;
}